

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemonize.cpp
# Opt level: O3

void __thiscall cppcms::impl::daemonizer::daemonize(daemonizer *this,value *conf)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  value_type_conflict *__val;
  group *pgVar5;
  passwd *ppVar6;
  int *piVar7;
  long *plVar8;
  ssize_t sVar9;
  cppcms_error *pcVar10;
  runtime_error *prVar11;
  size_type *psVar12;
  __gid_t __gid;
  __uid_t __uid;
  char *pcVar13;
  string pid;
  string lock_file;
  string chroot_dir;
  string user;
  string group;
  ostringstream ss;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  locale local_210 [8];
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  _Var2 = getppid();
  if (_Var2 != 1) {
    local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffffffffff00;
    bVar1 = json::value::get<bool>(conf,"daemon.enable",(bool *)local_1a8);
    if (bVar1) {
      iVar3 = open("/dev/null",2);
      if (iVar3 < 0) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Failed to open /dev/null","");
        cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      json::value::get_abi_cxx11_(&local_1c8,conf,"daemon.group","");
      if (local_1c8._M_string_length == 0) {
        __gid = 0xffffffff;
      }
      else {
        pgVar5 = getgrnam(local_1c8._M_dataplus._M_p);
        if (pgVar5 == (group *)0x0) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::operator+(local_1a8,"Invalid group ",&local_1c8);
          booster::runtime_error::runtime_error(prVar11,local_1a8);
          *(undefined ***)prVar11 = &PTR__runtime_error_00284840;
          (prVar11->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar11,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        __gid = pgVar5->gr_gid;
      }
      json::value::get_abi_cxx11_(&local_1e8,conf,"daemon.user","");
      if (local_1e8._M_string_length == 0) {
        __uid = 0xffffffff;
      }
      else {
        ppVar6 = getpwnam(local_1e8._M_dataplus._M_p);
        if (ppVar6 == (passwd *)0x0) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::operator+(local_1a8,"Invalid user ",&local_1e8);
          booster::runtime_error::runtime_error(prVar11,local_1a8);
          *(undefined ***)prVar11 = &PTR__runtime_error_00284840;
          (prVar11->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
          __cxa_throw(prVar11,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        __uid = ppVar6->pw_uid;
        if (__gid == 0xffffffff) {
          __gid = ppVar6->pw_gid;
        }
      }
      json::value::get_abi_cxx11_(&local_208,conf,"daemon.chroot","");
      if (local_208._M_string_length != 0) {
        global_urandom_fd = open("/dev/urandom",0);
        if (global_urandom_fd < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Failed to open /dev/urandom","");
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        iVar4 = chdir(local_208._M_dataplus._M_p);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+(local_1a8,"Failed to chdir to ",&local_208);
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        iVar4 = chroot(local_208._M_dataplus._M_p);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+(local_1a8,"Failed to chroot to ",&local_208);
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
      local_1a8[0]._M_dataplus._M_p._0_4_ = 0xffffffff;
      iVar4 = json::value::get<int>(conf,"daemon.fdlimit",(int *)local_1a8);
      if (iVar4 != -1) {
        local_230._M_dataplus._M_p = (pointer)(long)iVar4;
        local_230._M_string_length = (size_type)local_230._M_dataplus._M_p;
        iVar4 = setrlimit(RLIMIT_NOFILE,(rlimit *)&local_230);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Failed to change daemon.fdlimit","");
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
      if ((__gid != 0xffffffff) && (iVar4 = setgid(__gid), iVar4 < 0)) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(local_1a8,"Failed setgid to group ",&local_1c8);
        cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if ((__uid != 0xffffffff) && (iVar4 = setuid(__uid), iVar4 < 0)) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(local_1a8,"Failed setuid to user ",&local_1e8);
        cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      json::value::get_abi_cxx11_(&local_230,conf,"daemon.lock","");
      if ((char *)local_230._M_string_length == (char *)0x0) {
        iVar4 = -1;
      }
      else {
        if (*local_230._M_dataplus._M_p != '/') {
          local_278._M_dataplus._M_p = (pointer)0x0;
          local_278._M_string_length = 0;
          local_278.field_2._M_allocated_capacity = 0;
          local_278._M_dataplus._M_p = (pointer)operator_new(0x100);
          pcVar13 = local_278._M_dataplus._M_p + 0x100;
          local_278.field_2._M_allocated_capacity = (size_type)pcVar13;
          memset(local_278._M_dataplus._M_p,0,0x100);
          local_278._M_string_length = (size_type)pcVar13;
          while (pcVar13 = getcwd(local_278._M_dataplus._M_p,
                                  local_278._M_string_length - (long)local_278._M_dataplus._M_p),
                pcVar13 == (char *)0x0) {
            piVar7 = __errno_location();
            iVar4 = *piVar7;
            if (iVar4 != 0x22) {
              pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
              local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,"getcwd failed","");
              cppcms_error::cppcms_error(pcVar10,iVar4,local_1a8);
              __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)&local_278,
                       (local_278._M_string_length - (long)local_278._M_dataplus._M_p) * 2);
          }
          std::operator+(&local_250,"/",&local_230);
          strlen(pcVar13);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_250,0,(char *)0x0,(ulong)pcVar13);
          psVar12 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_1a8[0].field_2._0_8_ = *psVar12;
            local_1a8[0].field_2._8_8_ = plVar8[3];
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar12;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1a8[0]._M_string_length = plVar8[1];
          *plVar8 = (long)psVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          if (local_278._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_278._M_dataplus._M_p);
          }
        }
        iVar4 = open(local_230._M_dataplus._M_p,0xc2,0x1b6);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Failed to create a lock file","");
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        std::__cxx11::string::_M_assign((string *)&this->unlink_file);
      }
      _Var2 = fork();
      if (_Var2 < 0) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Fork failed","");
        cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
        __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if (_Var2 == 0) {
        _Var2 = getpid();
        this->real_pid = _Var2;
        _Var2 = setsid();
        if (_Var2 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"setsid failed","");
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        _Var2 = fork();
        if (_Var2 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar10 = (cppcms_error *)__cxa_allocate_exception(0x30);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"2nd fork failed","");
          cppcms_error::cppcms_error(pcVar10,iVar3,local_1a8);
          __cxa_throw(pcVar10,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        if (_Var2 == 0) {
          _Var2 = getpid();
          this->real_pid = _Var2;
          dup2(iVar3,0);
          dup2(iVar3,1);
          dup2(iVar3,2);
          close(iVar3);
          chdir("/");
          if (iVar4 != -1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::locale::classic();
            std::ios::imbue(local_210);
            std::locale::~locale(local_210);
            std::ostream::operator<<(local_1a8,this->real_pid);
            std::__cxx11::stringbuf::str();
            sVar9 = ::write(iVar4,local_250._M_dataplus._M_p,
                            CONCAT44(local_250._M_string_length._4_4_,
                                     (int)local_250._M_string_length));
            if ((int)sVar9 != (int)local_250._M_string_length) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_278,"Failed to write to lock file","");
              booster::runtime_error::runtime_error(prVar11,&local_278);
              *(undefined ***)prVar11 = &PTR__runtime_error_00284840;
              (prVar11->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868
              ;
              __cxa_throw(prVar11,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            close(iVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
            return;
          }
          operator_delete(local_1c8._M_dataplus._M_p);
          return;
        }
      }
      exit(0);
    }
  }
  return;
}

Assistant:

void daemonizer::daemonize(json::value const &conf)
	{
		if(getppid() == 1)
			return;
		
		if(!conf.get("daemon.enable",false))
			return;
		
		int gid = -1;
		int uid = -1;
		
		int devnull_fd = -1;
		int lock_fd = -1;

		try {
		
			devnull_fd = open("/dev/null",O_RDWR);
			
			if(devnull_fd < 0) {
				int err = errno;
				throw cppcms_error(err,"Failed to open /dev/null");
			}
			
			std::string group = conf.get("daemon.group","");
			if(!group.empty()) {
				struct group *gr = getgrnam(group.c_str());
				if(!gr)
					throw cppcms_error("Invalid group " + group);
				gid = gr->gr_gid;
			}
			
			std::string user = conf.get("daemon.user","");
			if(!user.empty()) {
				struct passwd *pw = getpwnam(user.c_str());
				if(!pw)
					throw cppcms_error("Invalid user " + user);
				uid = pw->pw_uid;
				if(gid==-1)
					gid = pw->pw_gid;
			}
			
			std::string chroot_dir = conf.get("daemon.chroot","");

			if(!chroot_dir.empty()) {
				global_urandom_fd = open("/dev/urandom",O_RDONLY);
				if(global_urandom_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to open /dev/urandom");
				}

				if(chdir(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chdir to " + chroot_dir);
				}
				if(chroot(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chroot to " + chroot_dir);
				}

			}

			int fd_limit = conf.get("daemon.fdlimit",-1);
			if(fd_limit != -1) {
				struct rlimit lm;
				lm.rlim_cur = fd_limit;
				lm.rlim_max = fd_limit;
				if(setrlimit(RLIMIT_NOFILE,&lm) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to change daemon.fdlimit");
				}
			}
			
			if(gid!=-1) {
				if(setgid(gid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setgid to group " + group);
				}
			}

			if(uid!=-1) {
				if(setuid(uid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setuid to user " + user);
				}
			}


			std::string lock_file = conf.get("daemon.lock","");
			if(!lock_file.empty()) {
				if(lock_file[0]!='/') {
					char *wd = 0;
					std::vector<char> buf(256);
					while((wd=getcwd(&buf.front(),buf.size()))==0 && errno==ERANGE)
						buf.resize(buf.size()*2);
					if(!wd) {
						int err=errno;
						throw cppcms_error(err,"getcwd failed");
					}
					lock_file=wd + ("/" + lock_file);
				}
				lock_fd = ::open(lock_file.c_str(),O_RDWR | O_CREAT | O_EXCL,0666);
				if(lock_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to create a lock file");
				}
				unlink_file = lock_file;
			}

			// forking twice
			int chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"Fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();
			
			if(setsid() < 0) {
				int err = errno;
				throw cppcms_error(err,"setsid failed");

			}
			chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"2nd fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();

			dup2(devnull_fd,0);
			dup2(devnull_fd,1);
			dup2(devnull_fd,2);

			close(devnull_fd);
			devnull_fd = -1;

			int chdir_r = chdir("/");
			(void)(chdir_r); // shut up GCC

			if(lock_fd!=-1) {
				std::ostringstream ss;
				ss.imbue(std::locale::classic());
				ss << real_pid;
				std::string pid = ss.str();
				int v = write(lock_fd,pid.c_str(),pid.size());
				if(v!=int(pid.size())) {
					throw cppcms_error("Failed to write to lock file");
				}
				close(lock_fd);
				lock_fd = -1;
			}
		}
		catch(...) {
			if(lock_fd >= 0)
				close(lock_fd);
			if(devnull_fd >=0)
				close(devnull_fd);
			if(global_urandom_fd >= 0)
				close(global_urandom_fd);
			throw;
		}
	}